

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelRead.cpp
# Opt level: O3

expected<idx2::chunk_cache,_idx2::idx2_err_code> *
idx2::ParallelReadChunk
          (expected<idx2::chunk_cache,_idx2::idx2_err_code> *__return_storage_ptr__,idx2_file *Idx2,
          decode_data *D,u64 Brick,i8 Level,i8 Subband,i16 BpKey)

{
  atomic<unsigned_long> *paVar1;
  decode_data *pdVar2;
  undefined8 ChunkCache_00;
  int iVar3;
  __off_t _Var4;
  __off_t _Var5;
  ulong uVar6;
  FILE *pFVar7;
  char cVar8;
  byte bVar9;
  unsigned_long *Key;
  uint uVar10;
  long lVar11;
  uint uVar12;
  undefined7 in_register_00000081;
  ulong uVar13;
  chunk_cache *Val;
  undefined7 in_register_00000089;
  str pcVar14;
  expected<idx2::chunk_cache,_idx2::idx2_err_code> *peVar15;
  long lVar16;
  ulong *puVar17;
  size_t sVar18;
  ulong uVar19;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar20;
  int ChunkSizesSz;
  int ChunkAddrsSz;
  int NChunks;
  u64 ChunkAddress;
  timer IOTimer;
  file_id FileId;
  iterator FileCacheIt;
  u64 ChunkAddr;
  int S;
  unique_lock<std::mutex> Lock;
  file_cache FileCache;
  timer IOTimer_1;
  chunk_cache ChunkCache;
  int local_2c4;
  int local_2c0;
  uint local_2bc;
  expected<idx2::chunk_cache,_idx2::idx2_err_code> *local_2b8;
  FILE *local_2b0;
  decode_data *local_2a8;
  undefined4 local_2a0;
  uint local_29c;
  undefined1 local_298 [40];
  allocator *local_270;
  buffer local_268;
  anon_union_8_2_2df48d06_for_stref_0 local_250 [2];
  undefined1 local_240 [16];
  bucket_status *local_230;
  long local_228;
  long local_220;
  buffer local_218;
  u64 local_1f8;
  ulong local_1f0;
  undefined1 local_1e8 [24];
  undefined1 local_1d0;
  undefined1 local_1c8 [48];
  hash_table<unsigned_long,_idx2::chunk_cache> local_198 [3];
  iterator local_f0;
  chunk_cache local_d0;
  
  local_1e8._16_8_ = &D->FileCacheMutex;
  local_1d0 = 0;
  local_2b8 = __return_storage_ptr__;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_1e8 + 0x10));
  local_1d0 = 1;
  local_29c = (uint)CONCAT71(in_register_00000081,Level);
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_2a0 = (undefined4)CONCAT71(in_register_00000089,Subband);
  local_298._24_8_ = Idx2;
  local_1f8 = Brick;
  ConstructFilePath((file_id *)local_250,Idx2,Brick,(i8)Key,Subband,BpKey);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)(local_240 + 8),(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)local_240,Key);
  clock_gettime(1,(timespec *)(local_298 + 0x20));
  local_2a8 = D;
  if ((*(char *)(*(long *)(local_228 + 0x10) + local_220) == '\x02') &&
     (local_230[0xc9] == Tombstone)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x33;
    cVar8 = '\0';
    peVar15 = local_2b8;
  }
  else {
    pFVar7 = fopen(local_250[0].Ptr,"rb");
    if (pFVar7 == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x36;
      lVar11 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar11) == '%') {
          cVar8 = '%';
          goto LAB_0019679d;
        }
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x3b8);
      cVar8 = '\'';
LAB_0019679d:
      lVar11 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar11) == cVar8) {
          lVar16 = *in_FS_OFFSET;
          iVar3 = snprintf((char *)(lVar16 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                           (ulong)*(uint *)(&action_s::NameMap + lVar11),
                           *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar11),
                           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                           ,0x36);
          snprintf((char *)(lVar16 + -0xf80) + iVar3,0x400 - (long)iVar3,"File: %s",local_250[0].Ptr
                  );
          cVar8 = '%';
          peVar15 = local_2b8;
          goto LAB_00196832;
        }
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x3b8);
      goto LAB_001969e1;
    }
    fseeko(pFVar7,0,2);
    _Var4 = ftello(pFVar7);
    local_1e8._12_4_ = 0;
    _Var5 = ftello(pFVar7);
    fseeko(pFVar7,_Var5 + -4,0);
    fread(local_1e8 + 0xc,4,1,pFVar7);
    fseeko(pFVar7,_Var5 + -4,0);
    fseeko(pFVar7,_Var4 - (int)local_1e8._12_4_,0);
    local_2bc = 0;
    _Var4 = ftello(pFVar7);
    fseeko(pFVar7,_Var4 + -4,0);
    fread(&local_2bc,4,1,pFVar7);
    fseeko(pFVar7,_Var4 + -4,0);
    _Var4 = ftello(pFVar7);
    fseeko(pFVar7,_Var4 + -4,0);
    fread(&local_2c0,4,1,pFVar7);
    fseeko(pFVar7,_Var4 + -4,0);
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunk();
    }
    local_298._0_8_ = (unsigned_long *)0x0;
    local_298._8_8_ = (chunk_cache *)0x0;
    local_298._16_8_ = &Mallocator()::Instance;
    lVar11 = (long)local_2c0;
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunk();
    }
    local_2b0 = pFVar7;
    AllocBuf((buffer *)local_298,lVar11,(allocator *)&Mallocator()::Instance);
    sVar18 = (size_t)local_2c0;
    if ((long)local_298._8_8_ < (long)sVar18) {
LAB_00196d0b:
      __assert_fail("Sz <= Size(*Buf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                    ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
    }
    _Var4 = ftello(pFVar7);
    fseeko(pFVar7,_Var4 - sVar18,0);
    fread((void *)local_298._0_8_,sVar18,1,pFVar7);
    fseeko(pFVar7,_Var4 - sVar18,0);
    pdVar2 = local_2a8;
    LOCK();
    (local_2a8->BytesData_).super___atomic_base<unsigned_long>._M_i =
         (local_2a8->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar18;
    UNLOCK();
    clock_gettime(1,(timespec *)local_1c8);
    LOCK();
    (pdVar2->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
         (pdVar2->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
         (long)((double)(long)(local_1c8._0_8_ - local_298._32_8_) * 1000000000.0 +
               (double)(local_1c8._8_8_ - (long)local_270));
    UNLOCK();
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunk();
    }
    local_218.Data = (byte *)0x0;
    local_218.Bytes = 0;
    local_218.Alloc = (allocator *)&Mallocator()::Instance;
    lVar11 = (long)(int)local_2bc;
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunk();
    }
    AllocBuf(&local_218,lVar11 << 3,(allocator *)&Mallocator()::Instance);
    DecompressBufZstd((buffer *)local_298,&local_218);
    clock_gettime(1,(timespec *)local_1c8);
    clock_gettime(1,(timespec *)(local_298 + 0x20));
    local_2c4 = 0;
    _Var4 = ftello(pFVar7);
    fseeko(pFVar7,_Var4 + -4,0);
    fread(&local_2c4,4,1,pFVar7);
    fseeko(pFVar7,_Var4 + -4,0);
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunk();
    }
    local_268.Data = (byte *)0x0;
    local_268.Bytes = 0;
    local_268.Alloc = (allocator *)&Mallocator()::Instance;
    lVar11 = (long)local_2c4;
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunk();
    }
    AllocBuf(&local_268,lVar11,(allocator *)&Mallocator()::Instance);
    pdVar2 = local_2a8;
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunk();
    }
    sVar18 = (size_t)local_2c4;
    if (local_268.Bytes < (long)sVar18) goto LAB_00196d0b;
    _Var4 = ftello(pFVar7);
    fseeko(pFVar7,_Var4 - sVar18,0);
    fread(local_268.Data,sVar18,1,pFVar7);
    fseeko(pFVar7,_Var4 - sVar18,0);
    LOCK();
    paVar1 = &pdVar2->BytesData_;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + sVar18;
    UNLOCK();
    clock_gettime(1,(timespec *)local_1c8);
    puVar17 = (ulong *)local_268.Data;
    LOCK();
    paVar1 = &pdVar2->DecodeIOTime_;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i +
         (long)((double)(long)(local_1c8._0_8_ - local_298._32_8_) * 1000000000.0 +
               (double)(local_1c8._8_8_ - (long)local_270));
    UNLOCK();
    uVar6 = *(ulong *)local_268.Data;
    file_cache::file_cache((file_cache *)local_1c8);
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunk();
    }
    Init<unsigned_long,idx2::chunk_cache>
              ((hash_table<unsigned_long,_idx2::chunk_cache> *)(local_1c8 + 0x30),10,
               (allocator *)&Mallocator()::Instance);
    local_1f0 = (ulong)local_2bc;
    if (local_1f0 != 0) {
      uVar19 = 0;
      pcVar14 = (str)0x0;
      uVar13 = 0;
      do {
        bVar9 = 0;
        lVar11 = 0;
        do {
          uVar12 = (uint)uVar13;
          if (0x39 < (int)uVar12) {
            uVar6 = *(ulong *)((long)puVar17 + (uVar13 >> 3));
            puVar17 = (ulong *)((long)puVar17 + (uVar13 >> 3));
            uVar12 = uVar12 & 7;
          }
          uVar13 = uVar6 >> ((byte)uVar12 & 0x3f);
          uVar10 = uVar12 + 7;
          if (0x38 < (int)uVar12) {
            uVar6 = *(ulong *)((long)puVar17 + (ulong)(uVar10 >> 3));
            puVar17 = (ulong *)((long)puVar17 + (ulong)(uVar10 >> 3));
            uVar10 = 0;
          }
          lVar11 = lVar11 + ((uVar13 & bitstream::Masks.Arr[7]) << (bVar9 & 0x3f));
          Val = (chunk_cache *)(uVar6 >> ((byte)uVar10 & 0x3f));
          uVar13 = (ulong)(uVar10 + 1);
          bVar9 = bVar9 + 7;
        } while (((ulong)Val & bitstream::Masks.Arr[1]) != 0);
        local_1e8._0_8_ = ((allocator *)((long)local_218.Data + uVar19 * 8))->_vptr_allocator;
        chunk_cache::chunk_cache(&local_d0);
        local_d0.ChunkPos = (i32)uVar19;
        Insert<unsigned_long,idx2::chunk_cache>
                  (&local_f0,(idx2 *)(local_1c8 + 0x30),
                   (hash_table<unsigned_long,_idx2::chunk_cache> *)local_1e8,
                   (unsigned_long *)&local_d0,Val);
        if ((long)local_1c8._32_8_ <= (long)local_1c8._24_8_) {
          GrowCapacity<long>((array<long> *)local_1c8,0);
        }
        pcVar14 = pcVar14 + lVar11;
        lVar11 = local_1c8._24_8_ + 1;
        ((anon_union_8_2_2df48d06_for_stref_0 *)local_1c8._0_8_)[local_1c8._24_8_].Ptr = pcVar14;
        uVar19 = uVar19 + 1;
        local_1c8._24_8_ = lVar11;
      } while (uVar19 != local_1f0);
    }
    pFVar7 = local_2b0;
    if (*(char *)(*(long *)(local_228 + 0x10) + local_220) == '\x02') {
      *(bucket_status **)(local_230 + 0x40) = local_198[0].Stats;
      *(i64 *)(local_230 + 0x48) = local_198[0].Size;
      *(i64 *)(local_230 + 0x50) = local_198[0].LogCapacity;
      *(allocator **)(local_230 + 0x58) = local_198[0].Alloc;
      *(unsigned_long **)(local_230 + 0x30) = local_198[0].Keys;
      *(chunk_cache **)(local_230 + 0x38) = local_198[0].Vals;
      *(bucket_status **)(local_230 + 0x40) = local_198[0].Stats;
      *(i64 *)(local_230 + 0x48) = local_198[0].Size;
      *(undefined8 *)local_230 = local_1c8._0_8_;
      *(undefined8 *)(local_230 + 8) = local_1c8._8_8_;
      *(undefined8 *)(local_230 + 0x10) = local_1c8._16_8_;
      *(undefined8 *)(local_230 + 0x18) = local_1c8._24_8_;
      *(undefined8 *)(local_230 + 0x10) = local_1c8._16_8_;
      *(undefined8 *)(local_230 + 0x18) = local_1c8._24_8_;
      *(undefined8 *)(local_230 + 0x20) = local_1c8._32_8_;
      *(ulong *)(local_230 + 0x28) = CONCAT44(local_1c8._44_4_,local_1c8._40_4_);
    }
    else {
      Insert<unsigned_long,idx2::file_cache>
                ((iterator *)(local_240 + 8),(unsigned_long *)local_240,(file_cache *)local_1c8);
    }
    peVar15 = local_2b8;
    local_230[0xc9] = Tombstone;
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x71;
    DeallocBuf(&local_268);
    DeallocBuf(&local_218);
    DeallocBuf((buffer *)local_298);
    cVar8 = '\0';
LAB_00196832:
    if (pFVar7 != (FILE *)0x0) {
      fclose(pFVar7);
    }
  }
  if ((cVar8 != '\0') || (*(char *)(*(long *)(local_228 + 0x10) + local_220) != '\x02')) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x94;
    lVar11 = 0x10;
    do {
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar11) == '%') {
        cVar8 = '%';
        goto LAB_001969ca;
      }
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x3b8);
    cVar8 = '\'';
LAB_001969ca:
    lVar11 = 0x10;
    do {
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar11) == cVar8) {
        lVar16 = *in_FS_OFFSET;
        iVar3 = snprintf((char *)(lVar16 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                         (ulong)*(uint *)(&action_s::NameMap + lVar11),
                         *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar11),
                         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                         ,0x94);
        snprintf((char *)(lVar16 + -0xf80) + iVar3,0x400 - (long)iVar3,"File: %s\n",local_250[0].Ptr
                );
        peVar15->_vptr_expected = (_func_int **)&PTR__expected_001d0bd8;
        (peVar15->field_1).Err.Msg = "File: %s\n";
        (peVar15->field_1).Err.StrGened = true;
        *(undefined2 *)((long)&peVar15->field_1 + 8) = 0x25;
        peVar15->Ok = false;
        goto LAB_00196a9d;
      }
      lVar11 = lVar11 + 0x18;
    } while (lVar11 != 0x3b8);
LAB_001969e1:
    __assert_fail("It != End(EnumS.NameMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.h"
                  ,0x38,"stref idx2::ToString(idx2_err_code)");
  }
  cVar8 = (char)local_29c;
  if ('\x0f' < cVar8) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
  }
  uVar6 = (ulong)((stack_array<int,_16> *)(local_298._24_8_ + 0xa00))->Arr[cVar8];
  lVar11 = 0x3f;
  if (uVar6 != 0) {
    for (; uVar6 >> lVar11 == 0; lVar11 = lVar11 + -1) {
    }
  }
  bVar9 = -(uVar6 == 0) | (byte)lVar11;
  local_298._0_8_ =
       ((ulong)((ushort)BpKey & 0xfff) |
       (long)((int)(char)local_2a0 << 0xc) + ((ulong)(local_29c & 0xff) << 0x3c)) +
       (local_1f8 >> ((1L << (bVar9 & 0x3f) != uVar6) + bVar9 & 0x3f)) * 0x40000;
  Lookup<unsigned_long,idx2::chunk_cache>
            ((iterator *)local_1c8,(idx2 *)(local_230 + 0x30),
             (hash_table<unsigned_long,_idx2::chunk_cache> *)local_298,
             (unsigned_long *)local_298._0_8_);
  ChunkCache_00 = local_1c8._8_8_;
  if ((*(bucket_status **)(local_1c8._16_8_ + 0x10))[local_1c8._24_8_] == Occupied) {
    if ((((bitstream *)(local_1c8._8_8_ + 0x68))->Stream).Bytes == 0) {
      clock_gettime(1,(timespec *)&local_f0);
      pFVar7 = fopen(local_250[0].Ptr,"rb");
      if (pFVar7 == (FILE *)0x0) {
        local_1c8._0_8_ = local_250;
        eVar20 = ParallelReadChunk::anon_class_8_1_1e916d15::operator()
                           ((anon_class_8_1_1e916d15 *)local_1c8);
        peVar15->_vptr_expected = (_func_int **)&PTR__expected_001d0bd8;
        (peVar15->field_1).Err.Msg = eVar20.Msg;
        *(short *)((long)&peVar15->field_1 + 8) = eVar20._8_2_;
        (peVar15->field_1).Err.StrGened = eVar20.StrGened;
        peVar15->Ok = false;
        goto LAB_00196a9d;
      }
      lVar11 = (long)*(i32 *)ChunkCache_00;
      if (lVar11 < 1) {
        lVar16 = 0;
      }
      else {
        lVar16 = *(long *)((*(undefined8 *)local_230 - 8) + lVar11 * 8);
      }
      lVar11 = *(long *)(*(undefined8 *)local_230 + lVar11 * 8);
      fseeko(pFVar7,lVar16,0);
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunk();
      }
      local_1c8._0_8_ = (anon_union_8_2_2df48d06_for_stref_0 *)0x0;
      local_1c8._8_8_ = (chunk_cache *)0x0;
      local_1c8._16_8_ = &Mallocator()::Instance;
      local_1c8._24_8_ = (byte *)0x0;
      local_1c8._32_8_ = 0;
      local_1c8._40_4_ = 0;
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunk();
      }
      (*(code *)*Mallocator()::Instance)(&Mallocator()::Instance,local_1c8,(lVar11 - lVar16) + 8);
      local_1c8._24_8_ = local_1c8._0_8_;
      local_1c8._40_4_ = 0;
      local_1c8._32_8_ = Empty;
      fread((void *)local_1c8._0_8_,local_1c8._8_8_,1,pFVar7);
      pdVar2 = local_2a8;
      LOCK();
      (local_2a8->BytesData_).super___atomic_base<unsigned_long>._M_i =
           (long)(i32 *)local_1c8._8_8_ +
           (local_2a8->BytesData_).super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
      clock_gettime(1,(timespec *)&local_d0);
      LOCK();
      (pdVar2->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (pdVar2->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)(CONCAT44(local_d0._4_4_,local_d0.ChunkPos) - (long)local_f0.Key) *
                  1000000000.0 + (double)((long)local_d0.Bricks.Buffer.Data - (long)local_f0.Val));
      UNLOCK();
      uVar6 = (ulong)((stack_array<int,_16> *)(local_298._24_8_ + 0xa00))->Arr[cVar8];
      lVar11 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      bVar9 = -(uVar6 == 0) | (byte)lVar11;
      DecompressChunk((bitstream *)local_1c8,(chunk_cache *)ChunkCache_00,local_298._0_8_,
                      (int)(char)((1L << (bVar9 & 0x3f) != uVar6) + bVar9));
      fclose(pFVar7);
    }
    peVar15->_vptr_expected = (_func_int **)&PTR__expected_001d0bd8;
    memcpy(&peVar15->field_1,(void *)ChunkCache_00,0xa0);
    peVar15->Ok = true;
  }
  else {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x9d;
    peVar15->_vptr_expected = (_func_int **)&PTR__expected_001d0bd8;
    (peVar15->field_1).Err.Msg = "";
    (peVar15->field_1).Err.StrGened = false;
    *(undefined2 *)((long)&peVar15->field_1 + 8) = 0x23;
    peVar15->Ok = false;
  }
LAB_00196a9d:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_1e8 + 0x10));
  return peVar15;
}

Assistant:

expected<chunk_cache, idx2_err_code>
ParallelReadChunk(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
    auto ChunkCacheIt = Lookup(D->FileCache.ChunkCaches, ChunkAddress);
    if (ChunkCacheIt)
      return *ChunkCacheIt.Val;

    bitstream ChunkStream;
    bool Result = Idx2.external_read(Idx2, ChunkStream.Stream, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    // decompress part
    chunk_cache ChunkCache;
    DecompressChunk(&ChunkStream, &ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
    Insert(&ChunkCacheIt, ChunkAddress, ChunkCache);
    return *ChunkCacheIt.Val;
  }
#endif

  std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, BpKey);
  // TODO: lock and be careful about invalidated pointer
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  auto Result = ParallelReadFile(Idx2, D, &FileCacheIt, FileId);
  if (!Result || !FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, BpKey);
  const file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkCaches)::iterator ChunkCacheIt;
  // TODO: lock and be careful about invalidated pointer
  ChunkCacheIt = Lookup(FileCache->ChunkCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);
  chunk_cache* ChunkCache = ChunkCacheIt.Val;
  if (Size(ChunkCache->ChunkStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkCache->ChunkPos;
    i64 ChunkOffset = ChunkPos > 0 ? FileCache->ChunkOffsets[ChunkPos - 1] : 0;
    i64 ChunkSize = FileCache->ChunkOffsets[ChunkPos] - ChunkOffset;
    idx2_FSeek(Fp, ChunkOffset, SEEK_SET);
    bitstream ChunkStream;
    // NOTE: not a memory leak since we will keep track of this in ChunkCache
    InitWrite(&ChunkStream, ChunkSize);
    ReadBuffer(Fp, &ChunkStream.Stream);
    D->BytesData_ += Size(ChunkStream.Stream);
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    // TODO: check for error
    DecompressChunk(&ChunkStream, ChunkCache, ChunkAddress, Log2Ceil(Idx2.BricksPerChunk[Level]));
  }

  return *ChunkCache;
}